

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool __thiscall mkvparser::CuePoint::Load(CuePoint *this,IMkvReader *pReader)

{
  long lVar1;
  undefined1 auVar2 [16];
  long lVar3;
  _func_int ***ppp_Var4;
  bool bVar5;
  longlong lVar6;
  long lVar7;
  long lVar8;
  longlong lVar9;
  ulong uVar10;
  void *pvVar11;
  long *in_RDI;
  TrackPosition *tp;
  longlong size_2;
  longlong id_2;
  long len_2;
  TrackPosition *p;
  longlong size_1;
  longlong id_1;
  long len_1;
  unsigned_long_long track_positions_count;
  longlong pos;
  longlong element_size;
  longlong size;
  longlong id;
  long len;
  longlong stop;
  longlong element_start;
  longlong pos_;
  void *local_c8;
  TrackPosition *in_stack_ffffffffffffff48;
  TrackPosition *pReader_00;
  longlong in_stack_ffffffffffffff50;
  IMkvReader *in_stack_ffffffffffffff58;
  IMkvReader *in_stack_ffffffffffffff60;
  IMkvReader *pIVar12;
  IMkvReader *in_stack_ffffffffffffff68;
  TrackPosition *this_00;
  long local_68;
  ulong local_60;
  long local_58;
  long local_38;
  bool local_1;
  
  if (in_RDI[3] < 0) {
    lVar1 = in_RDI[3];
    lVar3 = -lVar1;
    lVar6 = ReadID(in_stack_ffffffffffffff68,(longlong)in_stack_ffffffffffffff60,
                   (long *)in_stack_ffffffffffffff58);
    if (lVar6 == 0xbb) {
      lVar7 = local_38 * 2 + lVar3;
      lVar6 = ReadUInt(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                       &in_stack_ffffffffffffff48->m_track);
      lVar8 = lVar7 + lVar6;
      local_60 = 0;
      for (local_58 = lVar7; local_58 < lVar8; local_58 = lVar9 + local_58) {
        lVar6 = ReadID(in_stack_ffffffffffffff68,(longlong)in_stack_ffffffffffffff60,
                       (long *)in_stack_ffffffffffffff58);
        if ((lVar6 < 0) || (lVar8 < local_58 + local_68)) {
          return false;
        }
        lVar9 = ReadUInt(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                         &in_stack_ffffffffffffff48->m_track);
        if ((lVar9 < 0) || (lVar8 < local_68 + local_58 + local_68)) {
          return false;
        }
        local_58 = local_68 + local_68 + local_58;
        if (lVar8 < local_58 + lVar9) {
          return false;
        }
        if (lVar6 == 0xb3) {
          lVar6 = UnserializeUInt(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                                  (longlong)in_stack_ffffffffffffff48);
          in_RDI[3] = lVar6;
        }
        else if ((lVar6 == 0xb7) && (local_60 = local_60 + 1, 0xffffffff < local_60)) {
          return true;
        }
      }
      in_RDI[5] = local_60;
      if ((in_RDI[3] < 0) || (in_RDI[5] == 0)) {
        local_1 = false;
      }
      else {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = in_RDI[5];
        uVar10 = SUB168(auVar2 * ZEXT816(0x18),0);
        if (SUB168(auVar2 * ZEXT816(0x18),8) != 0) {
          uVar10 = 0xffffffffffffffff;
        }
        pvVar11 = operator_new__(uVar10,(nothrow_t *)&std::nothrow);
        local_c8 = (void *)0x0;
        if (pvVar11 != (void *)0x0) {
          local_c8 = pvVar11;
        }
        in_RDI[4] = (long)local_c8;
        if (in_RDI[4] == 0) {
          local_1 = false;
        }
        else {
          pReader_00 = (TrackPosition *)in_RDI[4];
          local_58 = lVar7;
          do {
            if (lVar8 <= local_58) {
              *in_RDI = lVar3;
              in_RDI[1] = lVar8 + lVar1;
              return true;
            }
            in_stack_ffffffffffffff58 =
                 (IMkvReader *)
                 ReadID((IMkvReader *)pReader_00,(longlong)in_stack_ffffffffffffff60,
                        (long *)in_stack_ffffffffffffff58);
            if (((long)in_stack_ffffffffffffff58 < 0) ||
               (lVar8 < (long)&in_stack_ffffffffffffff60->_vptr_IMkvReader + local_58)) {
              return false;
            }
            ppp_Var4 = &in_stack_ffffffffffffff60->_vptr_IMkvReader;
            in_stack_ffffffffffffff50 =
                 ReadUInt(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                          &in_stack_ffffffffffffff48->m_track);
            pIVar12 = in_stack_ffffffffffffff60;
            this_00 = pReader_00;
            if (in_stack_ffffffffffffff58 == (IMkvReader *)0xb7) {
              this_00 = pReader_00 + 1;
              bVar5 = TrackPosition::Parse
                                (this_00,in_stack_ffffffffffffff60,0xb7,in_stack_ffffffffffffff50);
              in_stack_ffffffffffffff48 = pReader_00;
              if (!bVar5) {
                return false;
              }
            }
            local_58 = (long)&in_stack_ffffffffffffff60->_vptr_IMkvReader +
                       (long)ppp_Var4 + in_stack_ffffffffffffff50 + local_58;
            in_stack_ffffffffffffff60 = pIVar12;
            pReader_00 = this_00;
          } while (local_58 <= lVar8);
          local_1 = false;
        }
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool CuePoint::Load(IMkvReader* pReader) {
  // odbgstream os;
  // os << "CuePoint::Load(begin): timecode=" << m_timecode << endl;

  if (m_timecode >= 0)  // already loaded
    return true;

  assert(m_track_positions == NULL);
  assert(m_track_positions_count == 0);

  long long pos_ = -m_timecode;
  const long long element_start = pos_;

  long long stop;

  {
    long len;

    const long long id = ReadID(pReader, pos_, len);
    if (id != libwebm::kMkvCuePoint)
      return false;

    pos_ += len;  // consume ID

    const long long size = ReadUInt(pReader, pos_, len);
    assert(size >= 0);

    pos_ += len;  // consume Size field
    // pos_ now points to start of payload

    stop = pos_ + size;
  }

  const long long element_size = stop - element_start;

  long long pos = pos_;

  // First count number of track positions
  unsigned long long track_positions_count = 0;
  while (pos < stop) {
    long len;

    const long long id = ReadID(pReader, pos, len);
    if ((id < 0) || (pos + len > stop)) {
      return false;
    }

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    if ((size < 0) || (pos + len > stop)) {
      return false;
    }

    pos += len;  // consume Size field
    if ((pos + size) > stop) {
      return false;
    }

    if (id == libwebm::kMkvCueTime)
      m_timecode = UnserializeUInt(pReader, pos, size);

    else if (id == libwebm::kMkvCueTrackPositions) {
      ++track_positions_count;
      if (track_positions_count > UINT_MAX)
        return E_PARSE_FAILED;
    }

    pos += size;  // consume payload
  }

  m_track_positions_count = static_cast<size_t>(track_positions_count);

  if (m_timecode < 0 || m_track_positions_count <= 0) {
    return false;
  }

  // os << "CuePoint::Load(cont'd): idpos=" << idpos
  //   << " timecode=" << m_timecode
  //   << endl;

  m_track_positions = new (std::nothrow) TrackPosition[m_track_positions_count];
  if (m_track_positions == NULL)
    return false;

  // Now parse track positions

  TrackPosition* p = m_track_positions;
  pos = pos_;

  while (pos < stop) {
    long len;

    const long long id = ReadID(pReader, pos, len);
    if (id < 0 || (pos + len) > stop)
      return false;

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    assert(size >= 0);
    assert((pos + len) <= stop);

    pos += len;  // consume Size field
    assert((pos + size) <= stop);

    if (id == libwebm::kMkvCueTrackPositions) {
      TrackPosition& tp = *p++;
      if (!tp.Parse(pReader, pos, size)) {
        return false;
      }
    }

    pos += size;  // consume payload
    if (pos > stop)
      return false;
  }

  assert(size_t(p - m_track_positions) == m_track_positions_count);

  m_element_start = element_start;
  m_element_size = element_size;

  return true;
}